

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool Fossilize::ZipDatabase::string_is_hex(char *str)

{
  byte bVar1;
  int iVar2;
  
  do {
    bVar1 = *str;
    if (bVar1 == 0) break;
    iVar2 = isxdigit((uint)bVar1);
    str = (char *)((byte *)str + 1);
  } while (iVar2 != 0);
  return bVar1 == 0;
}

Assistant:

static bool string_is_hex(const char *str)
	{
		while (*str)
		{
			if (!isxdigit(uint8_t(*str)))
				return false;
			str++;
		}
		return true;
	}